

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O0

void visit_module_decl(gvisitor_t *self,gnode_module_decl_t *node)

{
  gnode_module_decl_t *node_local;
  gvisitor_t *self_local;
  
  return;
}

Assistant:

static void visit_module_decl (gvisitor_t *self, gnode_module_decl_t *node) {
    #pragma unused(self, node)
    DEBUG_CODEGEN("visit_module_decl %s", node->identifier);

    // a module should be like a class with static entries
    // instantiated with import

//    gravity_module_t *module = gravity_module_new(GET_VM(), node->identifier);
//    CONTEXT_PUSH(module);
//
//    // process inner declarations
//    gnode_array_each(node->decls, {visit(val);});
//
//    // adjust declaration stack
//    CONTEXT_POP();
}